

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen2_2x3.cpp
# Opt level: O0

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcSurfaceStyle>
                 (DB *db,LIST *params,IfcSurfaceStyle *in)

{
  size_t sVar1;
  TypeError *this;
  TypeError *t_1;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_1;
  TypeError *t;
  undefined1 local_70 [8];
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg;
  allocator<char> local_49;
  string local_48;
  size_t local_28;
  size_t base;
  IfcSurfaceStyle *in_local;
  LIST *params_local;
  DB *db_local;
  
  base = (size_t)in;
  in_local = (IfcSurfaceStyle *)params;
  params_local = (LIST *)db;
  local_28 = GenericFill<Assimp::IFC::Schema_2x3::IfcPresentationStyle>
                       (db,params,&in->super_IfcPresentationStyle);
  sVar1 = EXPRESS::LIST::GetSize((LIST *)in_local);
  if (2 < sVar1) {
    local_28 = local_28 + 1;
    EXPRESS::LIST::operator[]((LIST *)local_70,(size_t)in_local);
    GenericConvert<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(base + 0x48),
               (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70,(DB *)params_local);
    std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
              ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70);
    local_28 = local_28 + 1;
    EXPRESS::LIST::operator[]((LIST *)&t_1,(size_t)in_local);
    GenericConvert<Assimp::STEP::EXPRESS::DataType,1ul,5ul>
              ((ListOf<Assimp::STEP::EXPRESS::DataType,_1UL,_5UL> *)(base + 0x68),
               (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_1,(DB *)params_local);
    std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
              ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_1);
    return local_28;
  }
  arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._3_1_ = 1;
  this = (TypeError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"expected 3 arguments to IfcSurfaceStyle",&local_49);
  TypeError::TypeError(this,&local_48,0xffffffffffffffff,0xffffffffffffffff);
  arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._3_1_ = 0;
  __cxa_throw(this,&TypeError::typeinfo,TypeError::~TypeError);
}

Assistant:

size_t GenericFill<IfcSurfaceStyle>(const DB& db, const LIST& params, IfcSurfaceStyle* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcPresentationStyle*>(in));
	if (params.GetSize() < 3) { throw STEP::TypeError("expected 3 arguments to IfcSurfaceStyle"); }    do { // convert the 'Side' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->Side, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 1 to IfcSurfaceStyle to be a `IfcSurfaceSide`")); }
    } while(0);
    do { // convert the 'Styles' argument
        std::shared_ptr<const DataType> arg = params[ base++ ];
        try { GenericConvert( in->Styles, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 2 to IfcSurfaceStyle to be a `SET [1:5] OF IfcSurfaceStyleElementSelect`")); }
    } while(0);
	return base;
}